

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

int mu_textbox_raw(mu_Context *ctx,char *buf,int bufsz,mu_Id id,mu_Rect r,int opt)

{
  mu_Color color_00;
  mu_Font font_00;
  int iVar1;
  int h;
  int y;
  size_t sVar2;
  mu_Vec2 pos;
  mu_Rect rect;
  int local_88;
  int local_7c;
  int texty;
  int textx;
  int ofx;
  int texth;
  int textw;
  mu_Font font;
  mu_Color color;
  int n;
  int len;
  int res;
  mu_Id id_local;
  int bufsz_local;
  char *buf_local;
  mu_Context *ctx_local;
  mu_Rect r_local;
  
  ctx_local._0_4_ = r.x;
  ctx_local._4_4_ = r.y;
  r_local.x = r.w;
  r_local.y = r.h;
  n = 0;
  mu_update_control(ctx,id,r,opt | 0x100);
  if (ctx->focus == id) {
    sVar2 = strlen(buf);
    color = SUB84(sVar2,0);
    sVar2 = strlen(ctx->input_text);
    if ((bufsz - (int)color) + -1 < (int)sVar2) {
      local_7c = (bufsz - (int)color) + -1;
    }
    else {
      sVar2 = strlen(ctx->input_text);
      local_7c = (int)sVar2;
    }
    if (0 < local_7c) {
      memcpy(buf + (int)color,ctx->input_text,(long)local_7c);
      color = (mu_Color)(local_7c + (int)color);
      buf[(int)color] = '\0';
      n = 4;
    }
    if (((ctx->key_pressed & 8U) != 0) && (0 < (int)color)) {
      do {
        color = (mu_Color)((int)color + -1);
      } while (((int)buf[(int)color] & 0xc0U) == 0x80 && 0 < (int)color);
      buf[(int)color] = '\0';
      n = 4;
    }
    if ((ctx->key_pressed & 0x10U) != 0) {
      mu_set_focus(ctx,0);
      n = n | 2;
    }
  }
  mu_draw_control_frame(ctx,id,r,9,opt);
  if (ctx->focus == id) {
    color_00 = ctx->style->colors[0];
    font_00 = ctx->style->font;
    iVar1 = (*ctx->text_width)(font_00,buf,-1,ctx->user_data);
    h = (*ctx->text_height)(font_00);
    local_88 = ((r_local.x - ctx->style->padding) - iVar1) + -1;
    if (ctx->style->padding <= local_88) {
      local_88 = ctx->style->padding;
    }
    y = ctx_local._4_4_ + (r_local.y - h) / 2;
    mu_push_clip_rect(ctx,r);
    pos = mu_vec2((int)ctx_local + local_88,y);
    mu_draw_text(ctx,font_00,buf,-1,pos,color_00);
    rect = mu_rect((int)ctx_local + local_88 + iVar1,y,1,h);
    mu_draw_rect(ctx,rect,color_00);
    mu_pop_clip_rect(ctx);
  }
  else {
    mu_draw_control_text(ctx,buf,r,0,opt);
  }
  return n;
}

Assistant:

int mu_textbox_raw(mu_Context *ctx, char *buf, int bufsz, mu_Id id, mu_Rect r,
  int opt)
{
  int res = 0;
  mu_update_control(ctx, id, r, opt | MU_OPT_HOLDFOCUS);

  if (ctx->focus == id) {
    /* handle text input */
    int len = strlen(buf);
    int n = mu_min(bufsz - len - 1, (int) strlen(ctx->input_text));
    if (n > 0) {
      memcpy(buf + len, ctx->input_text, n);
      len += n;
      buf[len] = '\0';
      res |= MU_RES_CHANGE;
    }
    /* handle backspace */
    if (ctx->key_pressed & MU_KEY_BACKSPACE && len > 0) {
      /* skip utf-8 continuation bytes */
      while ((buf[--len] & 0xc0) == 0x80 && len > 0);
      buf[len] = '\0';
      res |= MU_RES_CHANGE;
    }
    /* handle return */
    if (ctx->key_pressed & MU_KEY_RETURN) {
      mu_set_focus(ctx, 0);
      res |= MU_RES_SUBMIT;
    }
  }

  /* draw */
  mu_draw_control_frame(ctx, id, r, MU_COLOR_BASE, opt);
  if (ctx->focus == id) {
    mu_Color color = ctx->style->colors[MU_COLOR_TEXT];
    mu_Font font = ctx->style->font;
    int textw = ctx->text_width(font, buf, -1, ctx->user_data);
    int texth = ctx->text_height(font);
    int ofx = r.w - ctx->style->padding - textw - 1;
    int textx = r.x + mu_min(ofx, ctx->style->padding);
    int texty = r.y + (r.h - texth) / 2;
    mu_push_clip_rect(ctx, r);
    mu_draw_text(ctx, font, buf, -1, mu_vec2(textx, texty), color);
    mu_draw_rect(ctx, mu_rect(textx + textw, texty, 1, texth), color);
    mu_pop_clip_rect(ctx);
  } else {
    mu_draw_control_text(ctx, buf, r, MU_COLOR_TEXT, opt);
  }

  return res;
}